

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O2

bool fd::compare_jacobian
               (Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *x,
               Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *y,
               double test_eps,string *msg)

{
  PointerType pdVar1;
  PointerType pdVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  format_string_t<const_std::__cxx11::basic_string<char>_&,_const_double_&,_long_&,_long_&,_double,_double,_double_&,_double,_double>
  fmt;
  double *in_stack_ffffffffffffff80;
  double local_70;
  double abs_diff;
  double local_60;
  double local_58;
  double local_50;
  _Alloc_hider local_48;
  double test_eps_local;
  double local_38;
  
  bVar3 = true;
  local_48._M_p = (pointer)test_eps;
  for (local_38 = 0.0;
      (long)local_38 <
      (x->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value; local_38 = (double)((long)local_38 + 1)) {
    for (test_eps_local = 0.0;
        (long)test_eps_local <
        (x->
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value; test_eps_local = (double)((long)test_eps_local + 1)) {
      lVar4 = (x->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value * (long)test_eps_local;
      pdVar1 = (x->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      dVar7 = ABS(pdVar1[lVar4 + (long)local_38]);
      lVar5 = (y->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value * (long)test_eps_local;
      pdVar2 = (y->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      dVar6 = pdVar1[lVar4 + (long)local_38] - pdVar2[lVar5 + (long)local_38];
      dVar8 = ABS(pdVar2[lVar5 + (long)local_38]);
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      dVar7 = 1.0;
      if (1.0 <= dVar8) {
        dVar7 = dVar8;
      }
      local_70 = ABS(dVar6);
      if (dVar7 * (double)local_48._M_p < local_70) {
        abs_diff = pdVar1[lVar4 + (long)local_38];
        local_60 = pdVar2[lVar5 + (long)local_38];
        local_58 = ABS(dVar6 / pdVar1[lVar4 + (long)local_38]);
        local_50 = ABS(dVar6 / pdVar2[lVar5 + (long)local_38]);
        fmt.str_.size_ = (size_t)msg;
        fmt.str_.data_ = (char *)0x57;
        spdlog::
        debug<std::__cxx11::string_const&,double_const&,long&,long&,double,double,double&,double,double>
                  ((spdlog *)
                   "{} eps={:.3e} r={} c={} x={:.3e} y={:.3e} |x-y|={:.3e} |x-y|/|x|={:.3e} |x-y|/|y|={:3e}"
                   ,fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_48,&local_38,(long *)&test_eps_local,(long *)&abs_diff,&local_60,
                   &local_70,&local_58,&local_50,in_stack_ffffffffffffff80);
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool compare_jacobian(
    const Eigen::Ref<const Eigen::MatrixXd>& x,
    const Eigen::Ref<const Eigen::MatrixXd>& y,
    const double test_eps,
    const std::string& msg)
{
    assert(x.rows() == y.rows());
    assert(x.cols() == y.cols());

    bool same = true;
    for (long i = 0; i < x.rows(); i++) {
        for (long j = 0; j < x.cols(); j++) {
            double scale = std::max(
                std::max(std::abs(x(i, j)), std::abs(y(i, j))), double(1.0));

            double abs_diff = std::abs(x(i, j) - y(i, j));

            if (abs_diff > test_eps * scale) {
                spdlog::debug(
                    "{} eps={:.3e} r={} c={} x={:.3e} y={:.3e} "
                    "|x-y|={:.3e} |x-y|/|x|={:.3e} |x-y|/|y|={:3e}",
                    msg, test_eps, i, j, x(i, j), y(i, j), abs_diff,
                    abs_diff / std::abs(x(i, j)), abs_diff / std::abs(y(i, j)));
                same = false;
            }
        }
    }
    return same;
}